

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

int xmlSwitchInputEncodingInt
              (xmlParserCtxtPtr ctxt,xmlParserInputPtr input,xmlCharEncodingHandlerPtr handler,
              int len)

{
  int iVar1;
  xmlBufPtr pxVar2;
  size_t sVar3;
  size_t sVar4;
  uint use;
  int processed;
  int nbchars;
  int len_local;
  xmlCharEncodingHandlerPtr handler_local;
  xmlParserInputPtr input_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (handler == (xmlCharEncodingHandlerPtr)0x0) {
    return -1;
  }
  if (input == (xmlParserInputPtr)0x0) {
    return -1;
  }
  if (input->buf == (xmlParserInputBufferPtr)0x0) {
    xmlErrInternal(ctxt,"static memory buffer doesn\'t support encoding\n",(xmlChar *)0x0);
    xmlCharEncCloseFunc(handler);
    return -1;
  }
  ctxt->charset = 1;
  if (input->buf->encoder == (xmlCharEncodingHandlerPtr)0x0) {
    input->buf->encoder = handler;
    iVar1 = xmlBufIsEmpty(input->buf->buffer);
    if (iVar1 == 0) {
      if ((handler->name != (char *)0x0) &&
         ((((iVar1 = strcmp(handler->name,"UTF-16LE"), iVar1 == 0 ||
            (iVar1 = strcmp(handler->name,"UTF-16"), iVar1 == 0)) && (*input->cur == 0xff)) &&
          (input->cur[1] == 0xfe)))) {
        input->cur = input->cur + 2;
      }
      if (((handler->name != (char *)0x0) && (iVar1 = strcmp(handler->name,"UTF-16BE"), iVar1 == 0))
         && ((*input->cur == 0xfe && (input->cur[1] == 0xff)))) {
        input->cur = input->cur + 2;
      }
      if (((handler->name != (char *)0x0) && (iVar1 = strcmp(handler->name,"UTF-8"), iVar1 == 0)) &&
         ((*input->cur == 0xef && ((input->cur[1] == 0xbb && (input->cur[2] == 0xbf)))))) {
        input->cur = input->cur + 3;
      }
      iVar1 = (int)input->cur - (int)input->base;
      xmlBufShrink(input->buf->buffer,(long)iVar1);
      input->buf->raw = input->buf->buffer;
      pxVar2 = xmlBufCreate();
      input->buf->buffer = pxVar2;
      input->buf->rawconsumed = (long)iVar1;
      sVar3 = xmlBufUse(input->buf->raw);
      if (ctxt->html == 0) {
        use = xmlCharEncFirstLineInput(input->buf,len);
      }
      else {
        use = xmlCharEncInput(input->buf,1);
      }
      xmlBufResetInput(input->buf->buffer,input);
      if ((int)use < 0) {
        xmlErrInternal(ctxt,"switching encoding: encoder error\n",(xmlChar *)0x0);
        return -1;
      }
      sVar4 = xmlBufUse(input->buf->raw);
      input->buf->rawconsumed = ((sVar3 & 0xffffffff) - sVar4) + input->buf->rawconsumed;
    }
    return 0;
  }
  if (input->buf->encoder == handler) {
    return 0;
  }
  xmlCharEncCloseFunc(input->buf->encoder);
  input->buf->encoder = handler;
  return 0;
}

Assistant:

static int
xmlSwitchInputEncodingInt(xmlParserCtxtPtr ctxt, xmlParserInputPtr input,
                          xmlCharEncodingHandlerPtr handler, int len)
{
    int nbchars;

    if (handler == NULL)
        return (-1);
    if (input == NULL)
        return (-1);
    if (input->buf != NULL) {
	ctxt->charset = XML_CHAR_ENCODING_UTF8;

        if (input->buf->encoder != NULL) {
            /*
             * Check in case the auto encoding detection triggered
             * in already.
             */
            if (input->buf->encoder == handler)
                return (0);

            /*
             * "UTF-16" can be used for both LE and BE
             if ((!xmlStrncmp(BAD_CAST input->buf->encoder->name,
             BAD_CAST "UTF-16", 6)) &&
             (!xmlStrncmp(BAD_CAST handler->name,
             BAD_CAST "UTF-16", 6))) {
             return(0);
             }
             */

            /*
             * Note: this is a bit dangerous, but that's what it
             * takes to use nearly compatible signature for different
             * encodings.
             *
             * FIXME: Encoders might buffer partial byte sequences, so
             * this probably can't work. We should return an error and
             * make sure that callers never try to switch the encoding
             * twice.
             */
            xmlCharEncCloseFunc(input->buf->encoder);
            input->buf->encoder = handler;
            return (0);
        }
        input->buf->encoder = handler;

        /*
         * Is there already some content down the pipe to convert ?
         */
        if (xmlBufIsEmpty(input->buf->buffer) == 0) {
            int processed;
	    unsigned int use;

            /*
             * Specific handling of the Byte Order Mark for
             * UTF-16
             */
            if ((handler->name != NULL) &&
                (!strcmp(handler->name, "UTF-16LE") ||
                 !strcmp(handler->name, "UTF-16")) &&
                (input->cur[0] == 0xFF) && (input->cur[1] == 0xFE)) {
                input->cur += 2;
            }
            if ((handler->name != NULL) &&
                (!strcmp(handler->name, "UTF-16BE")) &&
                (input->cur[0] == 0xFE) && (input->cur[1] == 0xFF)) {
                input->cur += 2;
            }
            /*
             * Errata on XML-1.0 June 20 2001
             * Specific handling of the Byte Order Mark for
             * UTF-8
             */
            if ((handler->name != NULL) &&
                (!strcmp(handler->name, "UTF-8")) &&
                (input->cur[0] == 0xEF) &&
                (input->cur[1] == 0xBB) && (input->cur[2] == 0xBF)) {
                input->cur += 3;
            }

            /*
             * Shrink the current input buffer.
             * Move it as the raw buffer and create a new input buffer
             */
            processed = input->cur - input->base;
            xmlBufShrink(input->buf->buffer, processed);
            input->buf->raw = input->buf->buffer;
            input->buf->buffer = xmlBufCreate();
	    input->buf->rawconsumed = processed;
	    use = xmlBufUse(input->buf->raw);

            if (ctxt->html) {
                /*
                 * convert as much as possible of the buffer
                 */
                nbchars = xmlCharEncInput(input->buf, 1);
            } else {
                /*
                 * convert just enough to get
                 * '<?xml version="1.0" encoding="xxx"?>'
                 * parsed with the autodetected encoding
                 * into the parser reading buffer.
                 */
                nbchars = xmlCharEncFirstLineInput(input->buf, len);
            }
            xmlBufResetInput(input->buf->buffer, input);
            if (nbchars < 0) {
                xmlErrInternal(ctxt,
                               "switching encoding: encoder error\n",
                               NULL);
                return (-1);
            }
	    input->buf->rawconsumed += use - xmlBufUse(input->buf->raw);
        }
        return (0);
    } else {
	xmlErrInternal(ctxt,
                "static memory buffer doesn't support encoding\n", NULL);
        /*
         * Callers assume that the input buffer takes ownership of the
         * encoding handler. xmlCharEncCloseFunc frees unregistered
         * handlers and avoids a memory leak.
         */
        xmlCharEncCloseFunc(handler);
	return (-1);
    }
}